

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cc
# Opt level: O0

int process_policy_constraints
              (X509 *x509,size_t *explicit_policy,size_t *policy_mapping,size_t *inhibit_any_policy)

{
  int iVar1;
  POLICY_CONSTRAINTS *a;
  ASN1_INTEGER *skip_certs;
  bool bVar2;
  int ok;
  ASN1_INTEGER *inhibit_any_policy_ext;
  int ok_1;
  POLICY_CONSTRAINTS *constraints;
  size_t *psStack_30;
  int critical;
  size_t *inhibit_any_policy_local;
  size_t *policy_mapping_local;
  size_t *explicit_policy_local;
  X509 *x509_local;
  
  psStack_30 = inhibit_any_policy;
  inhibit_any_policy_local = policy_mapping;
  policy_mapping_local = explicit_policy;
  explicit_policy_local = (size_t *)x509;
  a = (POLICY_CONSTRAINTS *)
      X509_get_ext_d2i((X509 *)x509,0x191,(int *)((long)&constraints + 4),(int *)0x0);
  if ((a == (POLICY_CONSTRAINTS *)0x0) && (constraints._4_4_ != -1)) {
    return 0;
  }
  if (a != (POLICY_CONSTRAINTS *)0x0) {
    if ((a->requireExplicitPolicy == (ASN1_INTEGER *)0x0) &&
       (a->inhibitPolicyMapping == (ASN1_INTEGER *)0x0)) {
      ERR_put_error(0xb,0,0x90,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/policy.cc"
                    ,0x22f);
      POLICY_CONSTRAINTS_free(a);
      return 0;
    }
    iVar1 = apply_skip_certs((ASN1_INTEGER *)a->requireExplicitPolicy,policy_mapping_local);
    bVar2 = false;
    if (iVar1 != 0) {
      iVar1 = apply_skip_certs((ASN1_INTEGER *)a->inhibitPolicyMapping,inhibit_any_policy_local);
      bVar2 = iVar1 != 0;
    }
    POLICY_CONSTRAINTS_free(a);
    if (!bVar2) {
      return 0;
    }
  }
  skip_certs = (ASN1_INTEGER *)
               X509_get_ext_d2i((X509 *)explicit_policy_local,0x2ec,(int *)((long)&constraints + 4),
                                (int *)0x0);
  if ((skip_certs == (ASN1_INTEGER *)0x0) && (constraints._4_4_ != -1)) {
    x509_local._4_4_ = 0;
  }
  else {
    iVar1 = apply_skip_certs(skip_certs,psStack_30);
    ASN1_INTEGER_free((ASN1_INTEGER *)skip_certs);
    x509_local._4_4_ = iVar1;
  }
  return x509_local._4_4_;
}

Assistant:

static int process_policy_constraints(const X509 *x509, size_t *explicit_policy,
                                      size_t *policy_mapping,
                                      size_t *inhibit_any_policy) {
  int critical;
  POLICY_CONSTRAINTS *constraints = reinterpret_cast<POLICY_CONSTRAINTS *>(
      X509_get_ext_d2i(x509, NID_policy_constraints, &critical, NULL));
  if (constraints == NULL && critical != -1) {
    return 0;
  }
  if (constraints != NULL) {
    if (constraints->requireExplicitPolicy == NULL &&
        constraints->inhibitPolicyMapping == NULL) {
      // Per RFC 5280, section 4.2.1.11, at least one of the fields must be
      // present.
      OPENSSL_PUT_ERROR(X509, X509_R_INVALID_POLICY_EXTENSION);
      POLICY_CONSTRAINTS_free(constraints);
      return 0;
    }
    int ok =
        apply_skip_certs(constraints->requireExplicitPolicy, explicit_policy) &&
        apply_skip_certs(constraints->inhibitPolicyMapping, policy_mapping);
    POLICY_CONSTRAINTS_free(constraints);
    if (!ok) {
      return 0;
    }
  }

  ASN1_INTEGER *inhibit_any_policy_ext = reinterpret_cast<ASN1_INTEGER *>(
      X509_get_ext_d2i(x509, NID_inhibit_any_policy, &critical, NULL));
  if (inhibit_any_policy_ext == NULL && critical != -1) {
    return 0;
  }
  int ok = apply_skip_certs(inhibit_any_policy_ext, inhibit_any_policy);
  ASN1_INTEGER_free(inhibit_any_policy_ext);
  return ok;
}